

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall google::protobuf::Arena::AddBlock(Arena *this,Block *b)

{
  MutexLock l;
  MutexLock local_18;
  
  local_18.mu_ = (Mutex *)(this + 0x30);
  internal::Mutex::Lock(local_18.mu_);
  AddBlockInternal(this,b);
  internal::MutexLock::~MutexLock(&local_18);
  return;
}

Assistant:

void Arena::AddBlock(Block* b) {
  MutexLock l(&blocks_lock_);
  AddBlockInternal(b);
}